

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpWithTcpClient.cpp
# Opt level: O0

void __thiscall
sznet::net::KcpWithTcpClient::newTcpConnection(KcpWithTcpClient *this,sz_sock sockfd)

{
  undefined8 uVar1;
  TcpConnection *this_00;
  element_type *peVar2;
  MutexLockGuard local_1c0;
  MutexLockGuard lock;
  code *local_1b0;
  undefined8 local_1a8;
  type local_1a0;
  CloseCallback local_188;
  LengthHeaderCodec<std::shared_ptr<sznet::net::TcpConnection>_> *local_168;
  code *local_160;
  undefined8 local_158;
  type local_150;
  MessageCallback local_138;
  undefined1 local_118 [8];
  TcpConnectionPtr conn;
  sockaddr_in6 local_f8;
  undefined1 local_dc [8];
  InetAddress localAddr;
  string connName;
  string local_a0 [36];
  uint32_t local_7c;
  char local_78 [4];
  uint32_t connId;
  char buf [32];
  sockaddr_in6 local_4c;
  undefined1 local_30 [8];
  InetAddress peerAddr;
  sz_sock sockfd_local;
  KcpWithTcpClient *this_local;
  
  peerAddr.field_0._20_4_ = sockfd;
  unique0x10000439 = this;
  EventLoop::assertInLoopThread(this->m_loop);
  sockets::sz_sock_getpeeraddr(&local_4c,peerAddr.field_0._20_4_);
  InetAddress::InetAddress((InetAddress *)local_30,&local_4c);
  local_7c = this->m_nextConnId;
  this->m_nextConnId = local_7c + 1;
  InetAddress::toIpPort_abi_cxx11_((InetAddress *)local_a0);
  uVar1 = std::__cxx11::string::c_str();
  snprintf(local_78,0x20,":tcp-%s#%d",uVar1,(ulong)local_7c);
  std::__cxx11::string::~string(local_a0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (localAddr.field_0.m_addr6.sin6_addr.__in6_u.__u6_addr8 + 0xc),
                 (char *)&this->m_name);
  sockets::sz_sock_getlocaladdr(&local_f8,peerAddr.field_0._20_4_);
  InetAddress::InetAddress((InetAddress *)local_dc,&local_f8);
  this_00 = (TcpConnection *)operator_new(0x1d0);
  TcpConnection::TcpConnection
            (this_00,this->m_loop,
             (string *)(localAddr.field_0.m_addr6.sin6_addr.__in6_u.__u6_addr8 + 0xc),local_7c,
             peerAddr.field_0._20_4_,(InetAddress *)local_dc,(InetAddress *)local_30);
  std::shared_ptr<sznet::net::TcpConnection>::shared_ptr<sznet::net::TcpConnection,void>
            ((shared_ptr<sznet::net::TcpConnection> *)local_118,this_00);
  peVar2 = std::
           __shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_118);
  local_160 = LengthHeaderCodec<std::shared_ptr<sznet::net::TcpConnection>_>::onMessage;
  local_158 = 0;
  local_168 = &this->m_tcpCodec;
  std::
  bind<void(sznet::net::LengthHeaderCodec<std::shared_ptr<sznet::net::TcpConnection>>::*)(std::shared_ptr<sznet::net::TcpConnection>const&,sznet::net::Buffer*,sznet::Timestamp),sznet::net::LengthHeaderCodec<std::shared_ptr<sznet::net::TcpConnection>>*,std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::_Placeholder<3>const&>
            (&local_150,
             (offset_in_LengthHeaderCodec<std::shared_ptr<sznet::net::TcpConnection>_>_to_subr *)
             &local_160,&local_168,(_Placeholder<1> *)&std::placeholders::_1,
             (_Placeholder<2> *)&std::placeholders::_2,(_Placeholder<3> *)&std::placeholders::_3);
  std::
  function<void(std::shared_ptr<sznet::net::TcpConnection>const&,sznet::net::Buffer*,sznet::Timestamp)>
  ::
  function<std::_Bind<void(sznet::net::LengthHeaderCodec<std::shared_ptr<sznet::net::TcpConnection>>::*(sznet::net::LengthHeaderCodec<std::shared_ptr<sznet::net::TcpConnection>>*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>))(std::shared_ptr<sznet::net::TcpConnection>const&,sznet::net::Buffer*,sznet::Timestamp)>,void>
            ((function<void(std::shared_ptr<sznet::net::TcpConnection>const&,sznet::net::Buffer*,sznet::Timestamp)>
              *)&local_138,&local_150);
  TcpConnection::setMessageCallback(peVar2,&local_138);
  std::
  function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp)>
  ::~function(&local_138);
  peVar2 = std::
           __shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_118);
  local_1b0 = removeTcpConnection;
  local_1a8 = 0;
  lock.m_mutex = (MutexLock *)this;
  std::
  bind<void(sznet::net::KcpWithTcpClient::*)(std::shared_ptr<sznet::net::TcpConnection>const&),sznet::net::KcpWithTcpClient*,std::_Placeholder<1>const&>
            (&local_1a0,(offset_in_KcpWithTcpClient_to_subr *)&local_1b0,(KcpWithTcpClient **)&lock,
             (_Placeholder<1> *)&std::placeholders::_1);
  std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>::
  function<std::_Bind<void(sznet::net::KcpWithTcpClient::*(sznet::net::KcpWithTcpClient*,std::_Placeholder<1>))(std::shared_ptr<sznet::net::TcpConnection>const&)>,void>
            ((function<void(std::shared_ptr<sznet::net::TcpConnection>const&)> *)&local_188,
             &local_1a0);
  TcpConnection::setCloseCallback(peVar2,&local_188);
  std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>::~function(&local_188);
  MutexLockGuard::MutexLockGuard(&local_1c0,&this->m_mutex);
  std::shared_ptr<sznet::net::TcpConnection>::operator=
            (&this->m_tcpConnection,(shared_ptr<sznet::net::TcpConnection> *)local_118);
  MutexLockGuard::~MutexLockGuard(&local_1c0);
  peVar2 = std::
           __shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_118);
  TcpConnection::connectEstablished(peVar2);
  std::shared_ptr<sznet::net::TcpConnection>::~shared_ptr
            ((shared_ptr<sznet::net::TcpConnection> *)local_118);
  std::__cxx11::string::~string
            ((string *)(localAddr.field_0.m_addr6.sin6_addr.__in6_u.__u6_addr8 + 0xc));
  return;
}

Assistant:

void KcpWithTcpClient::newTcpConnection(sockets::sz_sock sockfd)
{
	m_loop->assertInLoopThread();
	InetAddress peerAddr(sockets::sz_sock_getpeeraddr(sockfd));
	char buf[32];
	uint32_t connId = m_nextConnId++;
	snprintf(buf, sizeof(buf), ":tcp-%s#%d", peerAddr.toIpPort().c_str(), connId);
	string connName = m_name + buf;

	InetAddress localAddr(sockets::sz_sock_getlocaladdr(sockfd));
	// FIXME poll with zero timeout to double confirm the new connection
	// FIXME use make_shared if necessary
	TcpConnectionPtr conn(new TcpConnection(m_loop, connName, connId, sockfd, localAddr, peerAddr));
	conn->setMessageCallback(std::bind(&LengthHeaderCodec<>::onMessage, &m_tcpCodec, std::placeholders::_1, std::placeholders::_2, std::placeholders::_3));
	// FIXME: unsafe
	conn->setCloseCallback(std::bind(&KcpWithTcpClient::removeTcpConnection, this, std::placeholders::_1));
	// ��������ͬʱ��д����race condition
	{
		MutexLockGuard lock(m_mutex);
		m_tcpConnection = conn;
	}
	conn->connectEstablished();
}